

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * __thiscall
QString::fromLocal8Bit(QString *__return_storage_ptr__,QString *this,QByteArrayView ba)

{
  long in_FS_OFFSET;
  undefined1 *local_68;
  QString *local_60;
  long local_58;
  undefined1 local_50 [8];
  State local_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (ba.m_size == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_00122f67;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    if (this == (QString *)0x0) {
      local_50 = (undefined1  [8])0x0;
      (__return_storage_ptr__->d).d = (Data *)0x0;
      local_48.flags.super_QFlagsStorageHelper<QStringConverter::Flag,_4>.
      super_QFlagsStorage<QStringConverter::Flag>.i =
           (QFlagsStorageHelper<QStringConverter::Flag,_4>)
           (QFlagsStorage<QStringConverter::Flag>)0x0;
      local_48.internalState = 0;
      local_48.remainingChars._0_4_ = 0;
      local_48.remainingChars._4_4_ = 0;
      (__return_storage_ptr__->d).ptr = L"";
      (__return_storage_ptr__->d).size = 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_50);
    }
    else {
      local_50 = (undefined1  [8])(QStringConverter::encodingInterfaces + 2);
      local_48.flags.super_QFlagsStorageHelper<QStringConverter::Flag,_4>.
      super_QFlagsStorage<QStringConverter::Flag>.i =
           (QFlagsStorageHelper<QStringConverter::Flag,_4>)
           (QFlagsStorage<QStringConverter::Flag>)0x1;
      local_48.internalState = 0;
      local_48.remainingChars._0_4_ = 0;
      local_48.remainingChars._4_4_ = 0;
      local_48.invalidChars._0_4_ = 0;
      local_48._20_8_ = 0;
      local_48.field_4.state_data[1] = 0;
      local_48.field_4.state_data[2] = 0;
      local_48.field_4.state_data[3] = 0;
      local_48.clearFn = (ClearDataFn)0x0;
      local_68 = local_50;
      local_60 = this;
      local_58 = ba.m_size;
      QStringDecoder::EncodedData::operator_cast_to_QString
                (__return_storage_ptr__,(EncodedData *)&local_68);
      QStringConverter::State::clear(&local_48);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
LAB_00122f67:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QString::fromLocal8Bit(QByteArrayView ba)
{
    if (ba.isNull())
        return QString();
    if (ba.isEmpty())
        return QString(DataPointer::fromRawData(&_empty, 0));
    QStringDecoder toUtf16(QStringDecoder::System, QStringDecoder::Flag::Stateless);
    return toUtf16(ba);
}